

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DXFLoader.cpp
# Opt level: O0

void __thiscall
Assimp::DXFImporter::ConvertMeshes(DXFImporter *this,aiScene *pScene,FileData *output)

{
  pointer *this_00;
  uint uVar1;
  PolyLine *pPVar2;
  float fVar3;
  size_t this_01;
  FileData *pFVar4;
  bool bVar5;
  int iVar6;
  reference __r;
  Logger *this_02;
  basic_formatter<char,std::char_traits<char>,std::allocator<char>> *pbVar7;
  basic_formatter *this_03;
  size_type sVar8;
  DeadlyImportError *pDVar9;
  reference pBVar10;
  mapped_type *ppBVar11;
  reference __r_00;
  element_type *peVar12;
  mapped_type_conflict3 *pmVar13;
  pointer __s;
  reference ppVar14;
  aiMesh *this_04;
  reference pvVar15;
  const_iterator cVar16;
  const_iterator __last;
  ulong *puVar17;
  reference ppPVar18;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_05;
  reference puVar19;
  uint *puVar20;
  size_type sVar21;
  const_reference pvVar22;
  vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *this_06;
  const_reference pvVar23;
  ulong uVar24;
  aiFace *local_5d0;
  aiColor4t<float> *local_5a0;
  aiColor4D *local_578;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_4a0;
  undefined1 local_492;
  allocator<char> local_491;
  string local_490;
  uint local_46c;
  aiFace *paStack_468;
  uint i;
  aiFace *face;
  const_iterator cStack_458;
  uint facenumv;
  const_iterator __end3_1;
  const_iterator __begin3_1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range3_1;
  const_iterator it_1;
  PolyLine *pl_3;
  iterator __end2_2;
  iterator __begin2_2;
  value_type *__range2_2;
  uint overall_indices;
  uint prims;
  aiFace *faces;
  aiColor4D *colors;
  aiVector3D *verts;
  PolyLine *pl_2;
  iterator __end2_1;
  iterator __begin2_1;
  value_type *__range2_1;
  uint cface;
  uint cvert;
  aiMesh *mesh;
  value_type *elem;
  iterator __end1_2;
  iterator __begin1_2;
  LayerMap *__range1_2;
  string local_390;
  element_type *local_370;
  element_type *local_368;
  undefined1 local_360 [8];
  vector<const_Assimp::DXF::PolyLine_*,_std::allocator<const_Assimp::DXF::PolyLine_*>_> pv;
  _Self local_340;
  iterator it;
  shared_ptr<const_Assimp::DXF::PolyLine> pl_1;
  iterator __end1_1;
  iterator __begin1_1;
  vector<std::shared_ptr<Assimp::DXF::PolyLine>,_std::allocator<std::shared_ptr<Assimp::DXF::PolyLine>_>_>
  *__range1_1;
  undefined1 local_308 [4];
  uint cur;
  vector<std::vector<const_Assimp::DXF::PolyLine_*,_std::allocator<const_Assimp::DXF::PolyLine_*>_>,_std::allocator<std::vector<const_Assimp::DXF::PolyLine_*,_std::allocator<const_Assimp::DXF::PolyLine_*>_>_>_>
  corr;
  LayerMap layers;
  string local_2b8;
  reference local_298;
  Block *bl_1;
  iterator __end1;
  iterator __begin1;
  vector<Assimp::DXF::Block,_std::allocator<Assimp::DXF::Block>_> *__range1;
  BlockMap blocks_by_name;
  Block *entities;
  string local_238;
  basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  string local_90;
  undefined1 local_70 [8];
  shared_ptr<const_Assimp::DXF::PolyLine> pl;
  const_iterator __end3;
  const_iterator __begin3;
  vector<std::shared_ptr<Assimp::DXF::PolyLine>,_std::allocator<std::shared_ptr<Assimp::DXF::PolyLine>_>_>
  *__range3;
  Block *bl;
  iterator __end2;
  iterator __begin2;
  vector<Assimp::DXF::Block,_std::allocator<Assimp::DXF::Block>_> *__range2;
  uint icount;
  uint vcount;
  FileData *output_local;
  aiScene *pScene_local;
  DXFImporter *this_local;
  
  _icount = output;
  output_local = (FileData *)pScene;
  pScene_local = (aiScene *)this;
  bVar5 = DefaultLogger::isNullLogger();
  pFVar4 = _icount;
  if (!bVar5) {
    __range2._4_4_ = 0;
    __range2._0_4_ = 0;
    __end2 = std::vector<Assimp::DXF::Block,_std::allocator<Assimp::DXF::Block>_>::begin
                       (&_icount->blocks);
    bl = (Block *)std::vector<Assimp::DXF::Block,_std::allocator<Assimp::DXF::Block>_>::end
                            (&pFVar4->blocks);
    while (bVar5 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<Assimp::DXF::Block_*,_std::vector<Assimp::DXF::Block,_std::allocator<Assimp::DXF::Block>_>_>
                                       *)&bl), bVar5) {
      pBVar10 = __gnu_cxx::
                __normal_iterator<Assimp::DXF::Block_*,_std::vector<Assimp::DXF::Block,_std::allocator<Assimp::DXF::Block>_>_>
                ::operator*(&__end2);
      __end3 = std::
               vector<std::shared_ptr<Assimp::DXF::PolyLine>,_std::allocator<std::shared_ptr<Assimp::DXF::PolyLine>_>_>
               ::begin(&pBVar10->lines);
      pl.super___shared_ptr<const_Assimp::DXF::PolyLine,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              std::
              vector<std::shared_ptr<Assimp::DXF::PolyLine>,_std::allocator<std::shared_ptr<Assimp::DXF::PolyLine>_>_>
              ::end(&pBVar10->lines);
      while (bVar5 = __gnu_cxx::operator!=
                               (&__end3,(__normal_iterator<const_std::shared_ptr<Assimp::DXF::PolyLine>_*,_std::vector<std::shared_ptr<Assimp::DXF::PolyLine>,_std::allocator<std::shared_ptr<Assimp::DXF::PolyLine>_>_>_>
                                         *)&pl.
                                            super___shared_ptr<const_Assimp::DXF::PolyLine,_(__gnu_cxx::_Lock_policy)2>
                                            ._M_refcount), bVar5) {
        __r = __gnu_cxx::
              __normal_iterator<const_std::shared_ptr<Assimp::DXF::PolyLine>_*,_std::vector<std::shared_ptr<Assimp::DXF::PolyLine>,_std::allocator<std::shared_ptr<Assimp::DXF::PolyLine>_>_>_>
              ::operator*(&__end3);
        std::shared_ptr<Assimp::DXF::PolyLine_const>::shared_ptr<Assimp::DXF::PolyLine,void>
                  ((shared_ptr<Assimp::DXF::PolyLine_const> *)local_70,__r);
        peVar12 = std::
                  __shared_ptr_access<const_Assimp::DXF::PolyLine,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<const_Assimp::DXF::PolyLine,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)local_70);
        sVar8 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size
                          (&peVar12->positions);
        __range2._4_4_ = (int)sVar8 + __range2._4_4_;
        peVar12 = std::
                  __shared_ptr_access<const_Assimp::DXF::PolyLine,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<const_Assimp::DXF::PolyLine,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)local_70);
        sVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&peVar12->counts);
        __range2._0_4_ = (int)sVar8 + (int)__range2;
        std::shared_ptr<const_Assimp::DXF::PolyLine>::~shared_ptr
                  ((shared_ptr<const_Assimp::DXF::PolyLine> *)local_70);
        __gnu_cxx::
        __normal_iterator<const_std::shared_ptr<Assimp::DXF::PolyLine>_*,_std::vector<std::shared_ptr<Assimp::DXF::PolyLine>,_std::allocator<std::shared_ptr<Assimp::DXF::PolyLine>_>_>_>
        ::operator++(&__end3);
      }
      __gnu_cxx::
      __normal_iterator<Assimp::DXF::Block_*,_std::vector<Assimp::DXF::Block,_std::allocator<Assimp::DXF::Block>_>_>
      ::operator++(&__end2);
    }
    this_02 = DefaultLogger::get();
    Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
    basic_formatter<char[30]>(&local_208,(char (*) [30])"DXF: Unexpanded polycount is ");
    pbVar7 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
             Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator_
                       ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                        &local_208,(uint *)&__range2);
    pbVar7 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
             Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator_
                       (pbVar7,(char (*) [19])", vertex count is ");
    this_03 = (basic_formatter *)
              Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
              operator_(pbVar7,(uint *)((long)&__range2 + 4));
    Formatter::basic_formatter::operator_cast_to_string(&local_90,this_03);
    Logger::debug(this_02,&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
    ~basic_formatter(&local_208);
  }
  sVar8 = std::vector<Assimp::DXF::Block,_std::allocator<Assimp::DXF::Block>_>::size
                    (&_icount->blocks);
  if (sVar8 == 0) {
    entities._6_1_ = 1;
    pDVar9 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"DXF: no data blocks loaded",
               (allocator<char> *)((long)&entities + 7));
    DeadlyImportError::DeadlyImportError(pDVar9,&local_238);
    entities._6_1_ = 0;
    __cxa_throw(pDVar9,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
  }
  blocks_by_name._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::DXF::Block_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::DXF::Block_*>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::DXF::Block_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::DXF::Block_*>_>_>
         *)&__range1);
  pFVar4 = _icount;
  __end1 = std::vector<Assimp::DXF::Block,_std::allocator<Assimp::DXF::Block>_>::begin
                     (&_icount->blocks);
  bl_1 = (Block *)std::vector<Assimp::DXF::Block,_std::allocator<Assimp::DXF::Block>_>::end
                            (&pFVar4->blocks);
  while (bVar5 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<Assimp::DXF::Block_*,_std::vector<Assimp::DXF::Block,_std::allocator<Assimp::DXF::Block>_>_>
                                     *)&bl_1), bVar5) {
    pBVar10 = __gnu_cxx::
              __normal_iterator<Assimp::DXF::Block_*,_std::vector<Assimp::DXF::Block,_std::allocator<Assimp::DXF::Block>_>_>
              ::operator*(&__end1);
    local_298 = pBVar10;
    ppBVar11 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::DXF::Block_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::DXF::Block_*>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::DXF::Block_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::DXF::Block_*>_>_>
                             *)&__range1,&pBVar10->name);
    *ppBVar11 = pBVar10;
    if ((blocks_by_name._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) &&
       (bVar5 = std::operator==(&local_298->name,"$ASSIMP_ENTITIES_MAGIC"), bVar5)) {
      blocks_by_name._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)local_298;
    }
    __gnu_cxx::
    __normal_iterator<Assimp::DXF::Block_*,_std::vector<Assimp::DXF::Block,_std::allocator<Assimp::DXF::Block>_>_>
    ::operator++(&__end1);
  }
  if (blocks_by_name._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
    layers._M_t._M_impl.super__Rb_tree_header._M_node_count._6_1_ = 1;
    pDVar9 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2b8,"DXF: no ENTITIES data block loaded",
               (allocator<char> *)
               ((long)&layers._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
    DeadlyImportError::DeadlyImportError(pDVar9,&local_2b8);
    layers._M_t._M_impl.super__Rb_tree_header._M_node_count._6_1_ = 0;
    __cxa_throw(pDVar9,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
  }
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
         *)&corr.
            super__Vector_base<std::vector<const_Assimp::DXF::PolyLine_*,_std::allocator<const_Assimp::DXF::PolyLine_*>_>,_std::allocator<std::vector<const_Assimp::DXF::PolyLine_*,_std::allocator<const_Assimp::DXF::PolyLine_*>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::vector<const_Assimp::DXF::PolyLine_*,_std::allocator<const_Assimp::DXF::PolyLine_*>_>,_std::allocator<std::vector<const_Assimp::DXF::PolyLine_*,_std::allocator<const_Assimp::DXF::PolyLine_*>_>_>_>
  ::vector((vector<std::vector<const_Assimp::DXF::PolyLine_*,_std::allocator<const_Assimp::DXF::PolyLine_*>_>,_std::allocator<std::vector<const_Assimp::DXF::PolyLine_*,_std::allocator<const_Assimp::DXF::PolyLine_*>_>_>_>
            *)local_308);
  ExpandBlockReferences
            (this,(Block *)blocks_by_name._M_t._M_impl.super__Rb_tree_header._M_node_count,
             (BlockMap *)&__range1);
  this_01 = blocks_by_name._M_t._M_impl.super__Rb_tree_header._M_node_count;
  __range1_1._4_4_ = 0;
  __end1_1 = std::
             vector<std::shared_ptr<Assimp::DXF::PolyLine>,_std::allocator<std::shared_ptr<Assimp::DXF::PolyLine>_>_>
             ::begin((vector<std::shared_ptr<Assimp::DXF::PolyLine>,_std::allocator<std::shared_ptr<Assimp::DXF::PolyLine>_>_>
                      *)blocks_by_name._M_t._M_impl.super__Rb_tree_header._M_node_count);
  pl_1.super___shared_ptr<const_Assimp::DXF::PolyLine,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         std::
         vector<std::shared_ptr<Assimp::DXF::PolyLine>,_std::allocator<std::shared_ptr<Assimp::DXF::PolyLine>_>_>
         ::end((vector<std::shared_ptr<Assimp::DXF::PolyLine>,_std::allocator<std::shared_ptr<Assimp::DXF::PolyLine>_>_>
                *)this_01);
  while (bVar5 = __gnu_cxx::operator!=
                           (&__end1_1,
                            (__normal_iterator<std::shared_ptr<Assimp::DXF::PolyLine>_*,_std::vector<std::shared_ptr<Assimp::DXF::PolyLine>,_std::allocator<std::shared_ptr<Assimp::DXF::PolyLine>_>_>_>
                             *)&pl_1.
                                super___shared_ptr<const_Assimp::DXF::PolyLine,_(__gnu_cxx::_Lock_policy)2>
                                ._M_refcount), bVar5) {
    __r_00 = __gnu_cxx::
             __normal_iterator<std::shared_ptr<Assimp::DXF::PolyLine>_*,_std::vector<std::shared_ptr<Assimp::DXF::PolyLine>,_std::allocator<std::shared_ptr<Assimp::DXF::PolyLine>_>_>_>
             ::operator*(&__end1_1);
    std::shared_ptr<Assimp::DXF::PolyLine_const>::shared_ptr<Assimp::DXF::PolyLine,void>
              ((shared_ptr<Assimp::DXF::PolyLine_const> *)&it,__r_00);
    peVar12 = std::
              __shared_ptr_access<const_Assimp::DXF::PolyLine,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<const_Assimp::DXF::PolyLine,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&it);
    sVar8 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size
                      (&peVar12->positions);
    if (sVar8 != 0) {
      peVar12 = std::
                __shared_ptr_access<const_Assimp::DXF::PolyLine,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<const_Assimp::DXF::PolyLine,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)&it);
      local_340._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                   *)&corr.
                      super__Vector_base<std::vector<const_Assimp::DXF::PolyLine_*,_std::allocator<const_Assimp::DXF::PolyLine_*>_>,_std::allocator<std::vector<const_Assimp::DXF::PolyLine_*,_std::allocator<const_Assimp::DXF::PolyLine_*>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,&peVar12->layer);
      pv.
      super__Vector_base<const_Assimp::DXF::PolyLine_*,_std::allocator<const_Assimp::DXF::PolyLine_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                    ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                           *)&corr.
                              super__Vector_base<std::vector<const_Assimp::DXF::PolyLine_*,_std::allocator<const_Assimp::DXF::PolyLine_*>_>,_std::allocator<std::vector<const_Assimp::DXF::PolyLine_*,_std::allocator<const_Assimp::DXF::PolyLine_*>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
      bVar5 = std::operator==(&local_340,
                              (_Self *)&pv.
                                        super__Vector_base<const_Assimp::DXF::PolyLine_*,_std::allocator<const_Assimp::DXF::PolyLine_*>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
      if (bVar5) {
        *(int *)&(output_local->blocks).
                 super__Vector_base<Assimp::DXF::Block,_std::allocator<Assimp::DXF::Block>_>._M_impl
                 .super__Vector_impl_data._M_end_of_storage =
             *(int *)&(output_local->blocks).
                      super__Vector_base<Assimp::DXF::Block,_std::allocator<Assimp::DXF::Block>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage + 1;
        peVar12 = std::
                  __shared_ptr_access<const_Assimp::DXF::PolyLine,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<const_Assimp::DXF::PolyLine,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)&it);
        pmVar13 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                                *)&corr.
                                   super__Vector_base<std::vector<const_Assimp::DXF::PolyLine_*,_std::allocator<const_Assimp::DXF::PolyLine_*>_>,_std::allocator<std::vector<const_Assimp::DXF::PolyLine_*,_std::allocator<const_Assimp::DXF::PolyLine_*>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage,
                               &peVar12->layer);
        *pmVar13 = __range1_1._4_4_;
        std::vector<const_Assimp::DXF::PolyLine_*,_std::allocator<const_Assimp::DXF::PolyLine_*>_>::
        vector((vector<const_Assimp::DXF::PolyLine_*,_std::allocator<const_Assimp::DXF::PolyLine_*>_>
                *)local_360);
        local_368 = std::
                    __shared_ptr_access<const_Assimp::DXF::PolyLine,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator*((__shared_ptr_access<const_Assimp::DXF::PolyLine,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)&it);
        std::vector<const_Assimp::DXF::PolyLine_*,_std::allocator<const_Assimp::DXF::PolyLine_*>_>::
        push_back((vector<const_Assimp::DXF::PolyLine_*,_std::allocator<const_Assimp::DXF::PolyLine_*>_>
                   *)local_360,&local_368);
        std::
        vector<std::vector<const_Assimp::DXF::PolyLine_*,_std::allocator<const_Assimp::DXF::PolyLine_*>_>,_std::allocator<std::vector<const_Assimp::DXF::PolyLine_*,_std::allocator<const_Assimp::DXF::PolyLine_*>_>_>_>
        ::push_back((vector<std::vector<const_Assimp::DXF::PolyLine_*,_std::allocator<const_Assimp::DXF::PolyLine_*>_>,_std::allocator<std::vector<const_Assimp::DXF::PolyLine_*,_std::allocator<const_Assimp::DXF::PolyLine_*>_>_>_>
                     *)local_308,(value_type *)local_360);
        std::vector<const_Assimp::DXF::PolyLine_*,_std::allocator<const_Assimp::DXF::PolyLine_*>_>::
        ~vector((vector<const_Assimp::DXF::PolyLine_*,_std::allocator<const_Assimp::DXF::PolyLine_*>_>
                 *)local_360);
        __range1_1._4_4_ = __range1_1._4_4_ + 1;
      }
      else {
        ppVar14 = std::
                  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
                  ::operator*(&local_340);
        pvVar15 = std::
                  vector<std::vector<const_Assimp::DXF::PolyLine_*,_std::allocator<const_Assimp::DXF::PolyLine_*>_>,_std::allocator<std::vector<const_Assimp::DXF::PolyLine_*,_std::allocator<const_Assimp::DXF::PolyLine_*>_>_>_>
                  ::operator[]((vector<std::vector<const_Assimp::DXF::PolyLine_*,_std::allocator<const_Assimp::DXF::PolyLine_*>_>,_std::allocator<std::vector<const_Assimp::DXF::PolyLine_*,_std::allocator<const_Assimp::DXF::PolyLine_*>_>_>_>
                                *)local_308,(ulong)ppVar14->second);
        local_370 = std::
                    __shared_ptr_access<const_Assimp::DXF::PolyLine,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator*((__shared_ptr_access<const_Assimp::DXF::PolyLine,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)&it);
        std::vector<const_Assimp::DXF::PolyLine_*,_std::allocator<const_Assimp::DXF::PolyLine_*>_>::
        push_back(pvVar15,&local_370);
      }
    }
    std::shared_ptr<const_Assimp::DXF::PolyLine>::~shared_ptr
              ((shared_ptr<const_Assimp::DXF::PolyLine> *)&it);
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<Assimp::DXF::PolyLine>_*,_std::vector<std::shared_ptr<Assimp::DXF::PolyLine>,_std::allocator<std::shared_ptr<Assimp::DXF::PolyLine>_>_>_>
    ::operator++(&__end1_1);
  }
  if (*(int *)&(output_local->blocks).
               super__Vector_base<Assimp::DXF::Block,_std::allocator<Assimp::DXF::Block>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage != 0) {
    uVar24 = (ulong)*(uint *)&(output_local->blocks).
                              super__Vector_base<Assimp::DXF::Block,_std::allocator<Assimp::DXF::Block>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage << 3;
    __s = (pointer)operator_new__(uVar24);
    memset(__s,0,uVar24);
    output_local[1].blocks.
    super__Vector_base<Assimp::DXF::Block,_std::allocator<Assimp::DXF::Block>_>._M_impl.
    super__Vector_impl_data._M_start = __s;
    this_00 = &corr.
               super__Vector_base<std::vector<const_Assimp::DXF::PolyLine_*,_std::allocator<const_Assimp::DXF::PolyLine_*>_>,_std::allocator<std::vector<const_Assimp::DXF::PolyLine_*,_std::allocator<const_Assimp::DXF::PolyLine_*>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    __end1_2 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
               ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                        *)this_00);
    elem = (value_type *)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                  *)this_00);
    do {
      bVar5 = std::operator!=(&__end1_2,(_Self *)&elem);
      if (!bVar5) {
        GenerateHierarchy(this,(aiScene *)output_local,_icount);
        GenerateMaterials(this,(aiScene *)output_local,_icount);
        std::
        vector<std::vector<const_Assimp::DXF::PolyLine_*,_std::allocator<const_Assimp::DXF::PolyLine_*>_>,_std::allocator<std::vector<const_Assimp::DXF::PolyLine_*,_std::allocator<const_Assimp::DXF::PolyLine_*>_>_>_>
        ::~vector((vector<std::vector<const_Assimp::DXF::PolyLine_*,_std::allocator<const_Assimp::DXF::PolyLine_*>_>,_std::allocator<std::vector<const_Assimp::DXF::PolyLine_*,_std::allocator<const_Assimp::DXF::PolyLine_*>_>_>_>
                   *)local_308);
        std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
        ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                *)&corr.
                   super__Vector_base<std::vector<const_Assimp::DXF::PolyLine_*,_std::allocator<const_Assimp::DXF::PolyLine_*>_>,_std::allocator<std::vector<const_Assimp::DXF::PolyLine_*,_std::allocator<const_Assimp::DXF::PolyLine_*>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::DXF::Block_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::DXF::Block_*>_>_>
        ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::DXF::Block_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::DXF::Block_*>_>_>
                *)&__range1);
        return;
      }
      ppVar14 = std::
                _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
                ::operator*(&__end1_2);
      this_04 = (aiMesh *)operator_new(0x520);
      aiMesh::aiMesh(this_04);
      *(aiMesh **)
       ((long)&((output_local[1].blocks.
                 super__Vector_base<Assimp::DXF::Block,_std::allocator<Assimp::DXF::Block>_>._M_impl
                 .super__Vector_impl_data._M_start)->lines).
               super__Vector_base<std::shared_ptr<Assimp::DXF::PolyLine>,_std::allocator<std::shared_ptr<Assimp::DXF::PolyLine>_>_>
       + (ulong)ppVar14->second * 8) = this_04;
      aiString::Set(&this_04->mName,&ppVar14->first);
      __range2_1._4_4_ = 0;
      __range2_1._0_4_ = 0;
      pvVar15 = std::
                vector<std::vector<const_Assimp::DXF::PolyLine_*,_std::allocator<const_Assimp::DXF::PolyLine_*>_>,_std::allocator<std::vector<const_Assimp::DXF::PolyLine_*,_std::allocator<const_Assimp::DXF::PolyLine_*>_>_>_>
                ::operator[]((vector<std::vector<const_Assimp::DXF::PolyLine_*,_std::allocator<const_Assimp::DXF::PolyLine_*>_>,_std::allocator<std::vector<const_Assimp::DXF::PolyLine_*,_std::allocator<const_Assimp::DXF::PolyLine_*>_>_>_>
                              *)local_308,(ulong)ppVar14->second);
      __end2_1 = std::
                 vector<const_Assimp::DXF::PolyLine_*,_std::allocator<const_Assimp::DXF::PolyLine_*>_>
                 ::begin(pvVar15);
      pl_2 = (PolyLine *)
             std::
             vector<const_Assimp::DXF::PolyLine_*,_std::allocator<const_Assimp::DXF::PolyLine_*>_>::
             end(pvVar15);
      while (bVar5 = __gnu_cxx::operator!=
                               (&__end2_1,
                                (__normal_iterator<const_Assimp::DXF::PolyLine_**,_std::vector<const_Assimp::DXF::PolyLine_*,_std::allocator<const_Assimp::DXF::PolyLine_*>_>_>
                                 *)&pl_2), bVar5) {
        ppPVar18 = __gnu_cxx::
                   __normal_iterator<const_Assimp::DXF::PolyLine_**,_std::vector<const_Assimp::DXF::PolyLine_*,_std::allocator<const_Assimp::DXF::PolyLine_*>_>_>
                   ::operator*(&__end2_1);
        pPVar2 = *ppPVar18;
        cVar16 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(&pPVar2->counts);
        __last = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(&pPVar2->counts);
        iVar6 = std::
                accumulate<__gnu_cxx::__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,int>
                          ((__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                            )cVar16._M_current,
                           (__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                            )__last._M_current,0);
        __range2_1._4_4_ = iVar6 + __range2_1._4_4_;
        sVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&pPVar2->counts);
        __range2_1._0_4_ = (int)sVar8 + (uint)__range2_1;
        __gnu_cxx::
        __normal_iterator<const_Assimp::DXF::PolyLine_**,_std::vector<const_Assimp::DXF::PolyLine_*,_std::allocator<const_Assimp::DXF::PolyLine_*>_>_>
        ::operator++(&__end2_1);
      }
      uVar24 = (ulong)__range2_1._4_4_;
      colors = (aiColor4D *)operator_new__(uVar24 * 0xc);
      if (uVar24 != 0) {
        local_578 = colors;
        do {
          aiVector3t<float>::aiVector3t((aiVector3t<float> *)local_578);
          local_578 = (aiColor4D *)&local_578->a;
        } while (local_578 != (aiColor4D *)(&colors->r + uVar24 * 3));
      }
      this_04->mVertices = (aiVector3D *)colors;
      uVar24 = (ulong)__range2_1._4_4_;
      faces = (aiFace *)operator_new__(uVar24 << 4);
      if (uVar24 != 0) {
        local_5a0 = (aiColor4t<float> *)faces;
        do {
          aiColor4t<float>::aiColor4t(local_5a0);
          local_5a0 = local_5a0 + 1;
        } while (local_5a0 != (aiColor4D *)faces + uVar24);
      }
      this_04->mColors[0] = (aiColor4D *)faces;
      uVar24 = (ulong)(uint)__range2_1;
      puVar17 = (ulong *)operator_new__(uVar24 << 4 | 8);
      *puVar17 = uVar24;
      _overall_indices = (aiFace *)(puVar17 + 1);
      if (uVar24 != 0) {
        local_5d0 = _overall_indices;
        do {
          aiFace::aiFace(local_5d0);
          local_5d0 = local_5d0 + 1;
        } while (local_5d0 != _overall_indices + uVar24);
      }
      this_04->mFaces = _overall_indices;
      this_04->mNumVertices = __range2_1._4_4_;
      this_04->mNumFaces = (uint)__range2_1;
      __range2_2._4_4_ = 0;
      __range2_2._0_4_ = 0;
      pvVar15 = std::
                vector<std::vector<const_Assimp::DXF::PolyLine_*,_std::allocator<const_Assimp::DXF::PolyLine_*>_>,_std::allocator<std::vector<const_Assimp::DXF::PolyLine_*,_std::allocator<const_Assimp::DXF::PolyLine_*>_>_>_>
                ::operator[]((vector<std::vector<const_Assimp::DXF::PolyLine_*,_std::allocator<const_Assimp::DXF::PolyLine_*>_>,_std::allocator<std::vector<const_Assimp::DXF::PolyLine_*,_std::allocator<const_Assimp::DXF::PolyLine_*>_>_>_>
                              *)local_308,(ulong)ppVar14->second);
      __end2_2 = std::
                 vector<const_Assimp::DXF::PolyLine_*,_std::allocator<const_Assimp::DXF::PolyLine_*>_>
                 ::begin(pvVar15);
      pl_3 = (PolyLine *)
             std::
             vector<const_Assimp::DXF::PolyLine_*,_std::allocator<const_Assimp::DXF::PolyLine_*>_>::
             end(pvVar15);
      while (bVar5 = __gnu_cxx::operator!=
                               (&__end2_2,
                                (__normal_iterator<const_Assimp::DXF::PolyLine_**,_std::vector<const_Assimp::DXF::PolyLine_*,_std::allocator<const_Assimp::DXF::PolyLine_*>_>_>
                                 *)&pl_3), bVar5) {
        ppPVar18 = __gnu_cxx::
                   __normal_iterator<const_Assimp::DXF::PolyLine_**,_std::vector<const_Assimp::DXF::PolyLine_*,_std::allocator<const_Assimp::DXF::PolyLine_*>_>_>
                   ::operator*(&__end2_2);
        it_1._M_current = (uint *)*ppPVar18;
        __range3_1 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                               (&((PolyLine *)it_1._M_current)->indices);
        this_05 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)(it_1._M_current + 0x12);
        __end3_1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(this_05);
        cStack_458 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(this_05);
        while (bVar5 = __gnu_cxx::operator!=(&__end3_1,&stack0xfffffffffffffba8), bVar5) {
          puVar19 = __gnu_cxx::
                    __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                    ::operator*(&__end3_1);
          face._4_4_ = *puVar19;
          paStack_468 = _overall_indices;
          _overall_indices->mNumIndices = face._4_4_;
          puVar20 = (uint *)operator_new__((ulong)face._4_4_ << 2);
          paStack_468->mIndices = puVar20;
          for (local_46c = 0; local_46c < face._4_4_; local_46c = local_46c + 1) {
            paStack_468->mIndices[local_46c] = (uint)__range2_2;
            sVar8 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size
                              ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                               it_1._M_current);
            sVar21 = std::vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>::size
                               ((vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *)
                                (it_1._M_current + 6));
            if (sVar8 != sVar21) {
              __assert_fail("pl->positions.size() == pl->colors.size()",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/DXF/DXFLoader.cpp"
                            ,0x14c,
                            "void Assimp::DXFImporter::ConvertMeshes(aiScene *, DXF::FileData &)");
            }
            puVar19 = __gnu_cxx::
                      __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                      ::operator*((__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                   *)&__range3_1);
            uVar1 = *puVar19;
            sVar8 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size
                              ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                               it_1._M_current);
            cVar16 = it_1;
            if (sVar8 <= uVar1) {
              local_492 = 1;
              pDVar9 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_490,"DXF: vertex index out of bounds",&local_491);
              DeadlyImportError::DeadlyImportError(pDVar9,&local_490);
              local_492 = 0;
              __cxa_throw(pDVar9,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError)
              ;
            }
            puVar19 = __gnu_cxx::
                      __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                      ::operator*((__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                   *)&__range3_1);
            pvVar22 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::
                      operator[]((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                                 cVar16._M_current,(ulong)*puVar19);
            fVar3 = pvVar22->y;
            colors->r = pvVar22->x;
            colors->g = fVar3;
            colors->b = pvVar22->z;
            this_06 = (vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *)
                      (it_1._M_current + 6);
            local_4a0 = __gnu_cxx::
                        __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                        ::operator++((__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                      *)&__range3_1,0);
            puVar19 = __gnu_cxx::
                      __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                      ::operator*(&local_4a0);
            pvVar23 = std::vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>::operator[]
                                (this_06,(ulong)*puVar19);
            fVar3 = pvVar23->g;
            faces->mNumIndices = (uint)pvVar23->r;
            *(float *)&faces->field_0x4 = fVar3;
            faces->mIndices = *(uint **)&pvVar23->b;
            __range2_2._0_4_ = (uint)__range2_2 + 1;
            faces = faces + 1;
            colors = (aiColor4D *)&colors->a;
          }
          uVar1 = paStack_468->mNumIndices;
          if (uVar1 == 1) {
            __range2_2._4_4_ = __range2_2._4_4_ | 1;
          }
          else if (uVar1 == 2) {
            __range2_2._4_4_ = __range2_2._4_4_ | 2;
          }
          else if (uVar1 == 3) {
            __range2_2._4_4_ = __range2_2._4_4_ | 4;
          }
          else {
            __range2_2._4_4_ = __range2_2._4_4_ | 8;
          }
          __gnu_cxx::
          __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
          ::operator++(&__end3_1);
          _overall_indices = _overall_indices + 1;
        }
        __gnu_cxx::
        __normal_iterator<const_Assimp::DXF::PolyLine_**,_std::vector<const_Assimp::DXF::PolyLine_*,_std::allocator<const_Assimp::DXF::PolyLine_*>_>_>
        ::operator++(&__end2_2);
      }
      this_04->mPrimitiveTypes = __range2_2._4_4_;
      this_04->mMaterialIndex = 0;
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
      ::operator++(&__end1_2);
    } while( true );
  }
  __range1_2._6_1_ = 1;
  pDVar9 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_390,"DXF: this file contains no 3d data",
             (allocator<char> *)((long)&__range1_2 + 7));
  DeadlyImportError::DeadlyImportError(pDVar9,&local_390);
  __range1_2._6_1_ = 0;
  __cxa_throw(pDVar9,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
}

Assistant:

void DXFImporter::ConvertMeshes(aiScene* pScene, DXF::FileData& output) {
    // the process of resolving all the INSERT statements can grow the
    // poly-count excessively, so log the original number.
    // XXX Option to import blocks as separate nodes?
    if (!DefaultLogger::isNullLogger()) {
        unsigned int vcount = 0, icount = 0;
        for (const DXF::Block& bl : output.blocks) {
            for (std::shared_ptr<const DXF::PolyLine> pl : bl.lines) {
                vcount += static_cast<unsigned int>(pl->positions.size());
                icount += static_cast<unsigned int>(pl->counts.size());
            }
        }

        ASSIMP_LOG_DEBUG_F("DXF: Unexpanded polycount is ", icount, ", vertex count is ", vcount);
    }

    if (! output.blocks.size()  ) {
        throw DeadlyImportError("DXF: no data blocks loaded");
    }

    DXF::Block* entities( nullptr );

    // index blocks by name
    DXF::BlockMap blocks_by_name;
    for (DXF::Block& bl : output.blocks) {
        blocks_by_name[bl.name] = &bl;
        if ( !entities && bl.name == AI_DXF_ENTITIES_MAGIC_BLOCK ) {
            entities = &bl;
        }
    }

    if (!entities) {
        throw DeadlyImportError("DXF: no ENTITIES data block loaded");
    }

    typedef std::map<std::string, unsigned int> LayerMap;

    LayerMap layers;
    std::vector< std::vector< const DXF::PolyLine*> > corr;

    // now expand all block references in the primary ENTITIES block
    // XXX this involves heavy memory copying, consider a faster solution for future versions.
    ExpandBlockReferences(*entities,blocks_by_name);

    unsigned int cur = 0;
    for (std::shared_ptr<const DXF::PolyLine> pl : entities->lines) {
        if (pl->positions.size()) {

            std::map<std::string, unsigned int>::iterator it = layers.find(pl->layer);
            if (it == layers.end()) {
                ++pScene->mNumMeshes;

                layers[pl->layer] = cur++;

                std::vector< const DXF::PolyLine* > pv;
                pv.push_back(&*pl);

                corr.push_back(pv);
            }
            else {
                corr[(*it).second].push_back(&*pl);
            }
        }
    }

    if ( 0 == pScene->mNumMeshes) {
        throw DeadlyImportError("DXF: this file contains no 3d data");
    }

    pScene->mMeshes = new aiMesh*[ pScene->mNumMeshes ] ();

    for(const LayerMap::value_type& elem : layers){
        aiMesh* const mesh =  pScene->mMeshes[elem.second] = new aiMesh();
        mesh->mName.Set(elem.first);

        unsigned int cvert = 0,cface = 0;
        for(const DXF::PolyLine* pl : corr[elem.second]){
            // sum over all faces since we need to 'verbosify' them.
            cvert += std::accumulate(pl->counts.begin(),pl->counts.end(),0);
            cface += static_cast<unsigned int>(pl->counts.size());
        }

        aiVector3D* verts = mesh->mVertices = new aiVector3D[cvert];
        aiColor4D* colors = mesh->mColors[0] = new aiColor4D[cvert];
        aiFace* faces = mesh->mFaces = new aiFace[cface];

        mesh->mNumVertices = cvert;
        mesh->mNumFaces = cface;

        unsigned int prims = 0;
        unsigned int overall_indices = 0;
        for(const DXF::PolyLine* pl : corr[elem.second]){

            std::vector<unsigned int>::const_iterator it = pl->indices.begin();
            for(unsigned int facenumv : pl->counts) {
                aiFace& face = *faces++;
                face.mIndices = new unsigned int[face.mNumIndices = facenumv];

                for (unsigned int i = 0; i < facenumv; ++i) {
                    face.mIndices[i] = overall_indices++;

                    ai_assert(pl->positions.size() == pl->colors.size());
                    if (*it >= pl->positions.size()) {
                        throw DeadlyImportError("DXF: vertex index out of bounds");
                    }

                    *verts++ = pl->positions[*it];
                    *colors++ = pl->colors[*it++];
                }

                // set primitive flags now, this saves the extra pass in ScenePreprocessor.
                switch(face.mNumIndices) {
                    case 1:
                        prims |= aiPrimitiveType_POINT;
                        break;
                    case 2:
                        prims |= aiPrimitiveType_LINE;
                        break;
                    case 3:
                        prims |= aiPrimitiveType_TRIANGLE;
                        break;
                    default:
                        prims |= aiPrimitiveType_POLYGON;
                        break;
                }
            }
        }

        mesh->mPrimitiveTypes = prims;
        mesh->mMaterialIndex = 0;
    }

    GenerateHierarchy(pScene,output);
    GenerateMaterials(pScene,output);
}